

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O2

CBString * nvarAttributesToUString(CBString *__return_storage_ptr__,UINT8 attributes)

{
  CBString local_30;
  
  Bstrlib::CBString::CBString(__return_storage_ptr__);
  if (1 < (byte)(attributes + 1)) {
    if ((attributes & 1) != 0) {
      Bstrlib::CBString::CBString(&local_30,", Runtime");
      Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
      Bstrlib::CBString::~CBString(&local_30);
    }
    if ((attributes & 2) != 0) {
      Bstrlib::CBString::CBString(&local_30,", AsciiName");
      Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
      Bstrlib::CBString::~CBString(&local_30);
    }
    if ((attributes & 4) != 0) {
      Bstrlib::CBString::CBString(&local_30,", Guid");
      Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
      Bstrlib::CBString::~CBString(&local_30);
    }
    if ((attributes & 8) != 0) {
      Bstrlib::CBString::CBString(&local_30,", DataOnly");
      Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
      Bstrlib::CBString::~CBString(&local_30);
    }
    if ((attributes & 0x10) != 0) {
      Bstrlib::CBString::CBString(&local_30,", ExtHeader");
      Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
      Bstrlib::CBString::~CBString(&local_30);
    }
    if ((attributes & 0x20) != 0) {
      Bstrlib::CBString::CBString(&local_30,", HwErrorRecord");
      Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
      Bstrlib::CBString::~CBString(&local_30);
    }
    if ((attributes & 0x40) != 0) {
      Bstrlib::CBString::CBString(&local_30,", AuthWrite");
      Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
      Bstrlib::CBString::~CBString(&local_30);
    }
    if ((char)attributes < '\0') {
      Bstrlib::CBString::CBString(&local_30,", Valid");
      Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
      Bstrlib::CBString::~CBString(&local_30);
    }
    Bstrlib::CBString::remove(__return_storage_ptr__,(char *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

UString nvarAttributesToUString(const UINT8 attributes)
{
    if (attributes == 0x00 || attributes == 0xFF)
        return UString();
    
    UString str;
    if (attributes & NVRAM_NVAR_ENTRY_RUNTIME)         str += UString(", Runtime");
    if (attributes & NVRAM_NVAR_ENTRY_ASCII_NAME)      str += UString(", AsciiName");
    if (attributes & NVRAM_NVAR_ENTRY_GUID)            str += UString(", Guid");
    if (attributes & NVRAM_NVAR_ENTRY_DATA_ONLY)       str += UString(", DataOnly");
    if (attributes & NVRAM_NVAR_ENTRY_EXT_HEADER)      str += UString(", ExtHeader");
    if (attributes & NVRAM_NVAR_ENTRY_HW_ERROR_RECORD) str += UString(", HwErrorRecord");
    if (attributes & NVRAM_NVAR_ENTRY_AUTH_WRITE)      str += UString(", AuthWrite");
    if (attributes & NVRAM_NVAR_ENTRY_VALID)           str += UString(", Valid");
    
    str.remove(0, 2); // Remove first comma and space
    return str;
}